

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void asm_snap_alloc(ASMState *as)

{
  byte bVar1;
  ushort uVar2;
  SnapShot *pSVar3;
  SnapEntry *pSVar4;
  uint ref;
  ulong uVar5;
  
  pSVar3 = as->T->snap;
  uVar2 = pSVar3[as->snapno].mapofs;
  pSVar4 = as->T->snapmap;
  bVar1 = pSVar3[as->snapno].nent;
  for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
    ref = (uint)(ushort)pSVar4[uVar2 + uVar5];
    if (0x7fff < ref) {
      asm_snap_alloc1(as,ref);
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as)
{
  SnapShot *snap = &as->T->snap[as->snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lua_assert(irt_type(IR(ref+1)->t) == IRT_SOFTFP);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}